

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  ostream *poVar3;
  ostringstream e;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  bVar2 = cmFSPermissions::stringToModeT(arg,permissions);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,this->Name);
    poVar3 = std::operator<<(poVar3," given invalid permission \"");
    poVar3 = std::operator<<(poVar3,(string *)arg);
    std::operator<<(poVar3,"\".");
    pcVar1 = this->Status;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
    std::__cxx11::string::~string(asStack_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return bVar2;
}

Assistant:

bool cmFileCopier::CheckPermissions(std::string const& arg,
                                    mode_t& permissions)
{
  if (!cmFSPermissions::stringToModeT(arg, permissions)) {
    std::ostringstream e;
    e << this->Name << " given invalid permission \"" << arg << "\".";
    this->Status.SetError(e.str());
    return false;
  }
  return true;
}